

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O2

bool draco::parser::ParseString(DecoderBuffer *buffer,string *out_string)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char c;
  bool end_reached;
  char local_2a;
  bool local_29;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  SkipWhitespace(buffer);
  local_29 = false;
  while( true ) {
    bVar2 = PeekWhitespace(buffer,&local_29);
    bVar1 = local_29;
    if (bVar2 || (local_29 & 1U) != 0) break;
    bVar3 = DecoderBuffer::Decode<char>(buffer,&local_2a);
    if (!bVar3) break;
    std::__cxx11::string::push_back((char)out_string);
  }
  return (bool)(bVar2 | bVar1 & 1U);
}

Assistant:

bool ParseString(DecoderBuffer *buffer, std::string *out_string) {
  out_string->clear();
  SkipWhitespace(buffer);
  bool end_reached = false;
  while (!PeekWhitespace(buffer, &end_reached) && !end_reached) {
    char c;
    if (!buffer->Decode(&c)) {
      return false;
    }
    *out_string += c;
  }
  return true;
}